

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void __thiscall
ft::vector<int,ft::allocator<int>>::insert<int*>
          (vector<int,ft::allocator<int>> *this,iterator position,int *first,int *last,type *param_4
          )

{
  long lVar1;
  iterator piVar2;
  value_type_conflict *val;
  value_type_conflict *local_50;
  vector<int,_ft::allocator<int>_> tmp;
  
  vector<int*>((vector<int,ft::allocator<int>> *)&local_50,position,
               (int *)(*(long *)(this + 8) * 4 + *(long *)this),(allocator_type *)&tmp.field_0x1f,
               (type *)0x0);
  lVar1 = *(long *)(this + 8);
  for (piVar2 = (iterator)(lVar1 * 4 + *(long *)this); lVar1 = lVar1 + -1, piVar2 != position;
      piVar2 = piVar2 + -1) {
    *(long *)(this + 8) = lVar1;
  }
  for (; val = local_50, first != last; first = first + 1) {
    vector<int,_ft::allocator<int>_>::push_back((vector<int,_ft::allocator<int>_> *)this,first);
  }
  for (; val != local_50 + (long)tmp.m_data; val = val + 1) {
    vector<int,_ft::allocator<int>_>::push_back((vector<int,_ft::allocator<int>_> *)this,val);
  }
  operator_delete(local_50);
  return;
}

Assistant:

void        insert(iterator position, Iterator first, Iterator last,
					   typename ft::_void_t<typename ft::iterator_traits<Iterator>::iterator_category>::type * = 0) {
		vector	tmp(position, this->end());
		while (position != this->end())
			this->pop_back();
		while (first != last) {
			this->push_back(*first);
			++first;
		}
		for (iterator it = tmp.begin(); it != tmp.end(); ++it)
			this->push_back(*it);
	}